

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeHandlerNoAttr *
Js::PathTypeHandlerNoAttr::New
          (ScriptContext *scriptContext,PathTypeHandlerNoAttr *typeHandler,bool isLocked,
          bool isShared)

{
  code *pcVar1;
  bool bVar2;
  uint16 pathLength;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int iVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  PathTypeHandlerNoAttr *this;
  TypePath *typePath;
  TrackAllocData local_48;
  byte local_1a;
  byte local_19;
  bool isShared_local;
  PathTypeHandlerBase *pPStack_18;
  bool isLocked_local;
  PathTypeHandlerNoAttr *typeHandler_local;
  ScriptContext *scriptContext_local;
  
  local_1a = isShared;
  local_19 = isLocked;
  pPStack_18 = &typeHandler->super_PathTypeHandlerBase;
  typeHandler_local = (PathTypeHandlerNoAttr *)scriptContext;
  if (typeHandler == (PathTypeHandlerNoAttr *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xdd7,"(typeHandler != nullptr)","typeHandler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)typeHandler_local);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0xdd8);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  this = (PathTypeHandlerNoAttr *)new<Memory::Recycler>(0x38,pRVar5,0x43c4b0);
  typePath = PathTypeHandlerBase::GetTypePath(pPStack_18);
  pathLength = PathTypeHandlerBase::GetPathLength(pPStack_18);
  iVar3 = DynamicTypeHandler::GetSlotCapacity(&pPStack_18->super_DynamicTypeHandler);
  inlineSlotCapacity =
       DynamicTypeHandler::GetInlineSlotCapacity(&pPStack_18->super_DynamicTypeHandler);
  offsetOfInlineSlots =
       DynamicTypeHandler::GetOffsetOfInlineSlots(&pPStack_18->super_DynamicTypeHandler);
  PathTypeHandlerNoAttr
            (this,typePath,pathLength,(PropertyIndex)iVar3,inlineSlotCapacity,offsetOfInlineSlots,
             (bool)(local_19 & 1),(bool)(local_1a & 1),(DynamicType *)0x0);
  return this;
}

Assistant:

PathTypeHandlerNoAttr * PathTypeHandlerNoAttr::New(ScriptContext * scriptContext, PathTypeHandlerNoAttr * typeHandler, bool isLocked, bool isShared)
    {
        Assert(typeHandler != nullptr);
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeHandlerNoAttr, typeHandler->GetTypePath(), typeHandler->GetPathLength(), static_cast<PropertyIndex>(typeHandler->GetSlotCapacity()), typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots(), isLocked, isShared);
    }